

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O0

void __thiscall Imf_3_4::SampleCountChannel::clear(SampleCountChannel *this)

{
  size_t sVar1;
  _func_int **pp_Var2;
  ImageChannel *in_RDI;
  size_t i;
  DeepImageLevel *in_stack_ffffffffffffff80;
  ulong local_10;
  
  local_10 = 0;
  while( true ) {
    sVar1 = ImageChannel::numPixels(in_RDI);
    if (sVar1 <= local_10) break;
    *(undefined4 *)((long)in_RDI[1]._vptr_ImageChannel + local_10 * 4) = 0;
    *(undefined4 *)(*(long *)&in_RDI[1]._xSampling + local_10 * 4) = 0;
    *(undefined8 *)(*(long *)&in_RDI[1]._pLinear + local_10 * 8) = 0;
    local_10 = local_10 + 1;
  }
  *(undefined8 *)&in_RDI[1]._pixelsPerColumn = 0;
  in_RDI[1]._numPixels = 0;
  pp_Var2 = (_func_int **)anon_unknown_6::roundBufferSizeUp(in_RDI[1]._numPixels);
  in_RDI[2]._vptr_ImageChannel = pp_Var2;
  deepLevel((SampleCountChannel *)0x139eb6);
  DeepImageLevel::initializeSampleLists(in_stack_ffffffffffffff80);
  return;
}

Assistant:

void
SampleCountChannel::clear ()
{
    try
    {
        for (size_t i = 0; i < numPixels (); ++i)
        {
            _numSamples[i]          = 0;
            _sampleListSizes[i]     = 0;
            _sampleListPositions[i] = 0;
        }

        _totalNumSamples      = 0;
        _totalSamplesOccupied = 0;
        _sampleBufferSize     = roundBufferSizeUp (_totalSamplesOccupied);

        deepLevel ().initializeSampleLists ();
    }
    catch (...)
    {
        level ().image ().resize (Box2i (V2i (0, 0), V2i (-1, -1)));
        throw;
    }
}